

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::
Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
::~Singleton(Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             *this)

{
  (this->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub =
       (_func_int **)&PTR__RegistryHub_00245ff8;
  (this->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub =
       (_func_int **)&PTR__RegistryHub_00246078;
  (this->super_RegistryHub).m_enumValuesRegistry.super_IMutableEnumValuesRegistry.
  _vptr_IMutableEnumValuesRegistry = (_func_int **)&PTR__EnumValuesRegistry_002457a0;
  std::
  vector<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>,_std::allocator<Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>_>_>
  ::~vector(&(this->super_RegistryHub).m_enumValuesRegistry.m_enumInfos);
  std::
  vector<std::__exception_ptr::exception_ptr,_std::allocator<std::__exception_ptr::exception_ptr>_>
  ::~vector(&(this->super_RegistryHub).m_exceptionRegistry.m_exceptions);
  (this->super_RegistryHub).m_tagAliasRegistry.super_ITagAliasRegistry._vptr_ITagAliasRegistry =
       (_func_int **)&PTR__TagAliasRegistry_00244138;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>_>
  ::~_Rb_tree(&(this->super_RegistryHub).m_tagAliasRegistry.m_registry._M_t);
  (this->super_RegistryHub).m_exceptionTranslatorRegistry.super_IExceptionTranslatorRegistry.
  _vptr_IExceptionTranslatorRegistry = (_func_int **)&PTR__ExceptionTranslatorRegistry_00243fc8;
  std::
  vector<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>,_std::allocator<Catch::Detail::unique_ptr<const_Catch::IExceptionTranslator>_>_>
  ::~vector(&(this->super_RegistryHub).m_exceptionTranslatorRegistry.m_translators);
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::~unique_ptr
            (&(this->super_RegistryHub).m_reporterRegistry.m_impl);
  TestRegistry::~TestRegistry(&(this->super_RegistryHub).m_testCaseRegistry);
  operator_delete(this,0x138);
  return;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }